

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

FName MODtoDamageType(int mod)

{
  int in_ESI;
  undefined4 in_register_0000003c;
  FName *this;
  int mod_local;
  
  this = (FName *)CONCAT44(in_register_0000003c,mod);
  if (in_ESI == 9) {
    FName::FName(this,NAME_BFGSplash);
  }
  else if (in_ESI == 0xc) {
    FName::FName(this,NAME_Drowning);
  }
  else if (in_ESI == 0xd) {
    FName::FName(this,NAME_Slime);
  }
  else if (in_ESI == 0xe) {
    FName::FName(this,NAME_Fire);
  }
  else if (in_ESI == 0xf) {
    FName::FName(this,NAME_Crush);
  }
  else if (in_ESI == 0x10) {
    FName::FName(this,NAME_Telefrag);
  }
  else if (in_ESI == 0x11) {
    FName::FName(this,NAME_Falling);
  }
  else if (in_ESI == 0x12) {
    FName::FName(this,NAME_Suicide);
  }
  else if (in_ESI == 0x14) {
    FName::FName(this,NAME_Exit);
  }
  else if (in_ESI == 0x16) {
    FName::FName(this,NAME_Melee);
  }
  else if (in_ESI == 0x17) {
    FName::FName(this,NAME_Railgun);
  }
  else if (in_ESI == 0x18) {
    FName::FName(this,NAME_Ice);
  }
  else if (in_ESI == 0x19) {
    FName::FName(this,NAME_Disintegrate);
  }
  else if (in_ESI == 0x1a) {
    FName::FName(this,NAME_Poison);
  }
  else if (in_ESI == 0x1b) {
    FName::FName(this,NAME_Electric);
  }
  else if (in_ESI == 1000) {
    FName::FName(this,NAME_Massacre);
  }
  else {
    FName::FName(this,NAME_None);
  }
  return (FName)mod;
}

Assistant:

FName MODtoDamageType (int mod)
{
	switch (mod)
	{
	default:	return NAME_None;			break;
	case 9:		return NAME_BFGSplash;		break;
	case 12:	return NAME_Drowning;		break;
	case 13:	return NAME_Slime;			break;
	case 14:	return NAME_Fire;			break;
	case 15:	return NAME_Crush;			break;
	case 16:	return NAME_Telefrag;		break;
	case 17:	return NAME_Falling;		break;
	case 18:	return NAME_Suicide;		break;
	case 20:	return NAME_Exit;			break;
	case 22:	return NAME_Melee;			break;
	case 23:	return NAME_Railgun;		break;
	case 24:	return NAME_Ice;			break;
	case 25:	return NAME_Disintegrate;	break;
	case 26:	return NAME_Poison;			break;
	case 27:	return NAME_Electric;		break;
	case 1000:	return NAME_Massacre;		break;
	}
}